

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gulcalc.cpp
# Opt level: O1

void __thiscall gulcalc::outputcoveragedata(gulcalc *this,int event_id)

{
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *this_00;
  float fVar1;
  int iVar2;
  pointer pvVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  gulcoverageSampleslevel gc;
  gulcoverageSampleslevel local_40;
  
  if ((this->opt_).coverageLevelOutput != false) {
    this_00 = &this->cov_;
    pvVar3 = (this->cov_).
             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (1 < (ulong)(((long)(this->cov_).
                           super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3) *
                   -0x5555555555555555)) {
      uVar6 = 1;
      do {
        if (*(pointer *)
             ((long)&pvVar3[uVar6].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data + 8) !=
            pvVar3[uVar6].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start) {
          local_40.coverage_id = (int)uVar6;
          pvVar3 = (this_00->
                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          lVar4 = *(long *)&pvVar3[uVar6].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data;
          local_40.event_id = event_id;
          if (4 < (ulong)((long)*(pointer *)
                                 ((long)&pvVar3[uVar6].
                                         super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                         super__Vector_impl_data + 8) - lVar4)) {
            lVar5 = (long)local_40.coverage_id;
            uVar7 = 1;
            do {
              iVar2 = (int)uVar7;
              local_40.sidx = iVar2 + -2;
              local_40.loss = *(float *)(lVar4 + uVar7 * 4);
              fVar1 = (this->coverages_->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                      super__Vector_impl_data._M_start[lVar5];
              if (fVar1 < local_40.loss) {
                local_40.loss = fVar1;
              }
              if ((iVar2 == 1) || ((iVar2 != 2 && (this->loss_threshold_ <= (double)local_40.loss)))
                 ) {
                covoutputgul(this,&local_40);
              }
              uVar7 = uVar7 + 1;
              pvVar3 = (this_00->
                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              lVar4 = *(long *)&pvVar3[uVar6].super__Vector_base<float,_std::allocator<float>_>.
                                _M_impl.super__Vector_impl_data;
            } while (uVar7 < (ulong)((long)*(pointer *)
                                            ((long)&pvVar3[uVar6].
                                                                                                        
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data + 8) - lVar4 >> 2)
                    );
          }
        }
        uVar6 = uVar6 + 1;
        pvVar3 = (this->cov_).
                 super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar6 < (ulong)(((long)(this->cov_).
                                      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3
                               ) * -0x5555555555555555));
    }
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::clear(this_00);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::resize(this_00,(long)(this->coverages_->super__Vector_base<float,_std::allocator<float>_>).
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->coverages_->super__Vector_base<float,_std::allocator<float>_>).
                           _M_impl.super__Vector_impl_data._M_start >> 2);
    return;
  }
  return;
}

Assistant:

void gulcalc::outputcoveragedata(int event_id)
{
	if (opt_.coverageLevelOutput == false) return;
	for (size_t j = 1; j < cov_.size(); j++) {
		if (cov_[j].size() > 0) {
			gulcoverageSampleslevel gc;
			gc.event_id = event_id;
			gc.coverage_id = j;
			for (size_t i = 1; i < cov_[j].size(); i++) {
				gc.sidx = i - 2;
				gc.loss = cov_[j][i];
				OASIS_FLOAT tiv = (*coverages_)[gc.coverage_id];
				if (gc.loss > tiv) gc.loss = tiv;
				if (gc.sidx) {
					if (gc.sidx == -1) {
						covoutputgul(gc);		// always output the mean	
					}
					else {
						if (gc.loss >= loss_threshold_) {
							covoutputgul(gc);
						}
					}
				}
			}

		}
	}
	cov_.clear();
	cov_.resize(coverages_->size());
}